

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Value * __thiscall flow::IRBuilder::createSCmpLT(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *pBVar4;
  Value *rhs_local;
  Value *lhs_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  rhs_local = rhs;
  lhs_local = lhs;
  if (lhs->type_ != rhs->type_) {
    __assert_fail("lhs->type() == rhs->type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x1c3,
                  "Value *flow::IRBuilder::createSCmpLT(Value *, Value *, const std::string &)");
  }
  if (lhs->type_ != String) {
    __assert_fail("lhs->type() == LiteralType::String",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                  ,0x1c4,
                  "Value *flow::IRBuilder::createSCmpLT(Value *, Value *, const std::string &)");
  }
  lVar2 = __dynamic_cast(lhs,&Value::typeinfo,
                         &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  if (lVar2 != 0) {
    lVar3 = __dynamic_cast(rhs,&Value::typeinfo,
                           &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    if (lVar3 != 0) {
      std::__cxx11::string::string((string *)&local_60,(string *)(lVar2 + 0x48));
      std::__cxx11::string::string((string *)&local_40,(string *)(lVar3 + 0x48));
      bVar1 = std::operator<(&local_60,&local_40);
      lVar2 = 0x68;
      if (bVar1) {
        lVar2 = 0x18;
      }
      pBVar4 = (BinaryInstr<(flow::BinaryOperator)26,_(flow::LiteralType)1> *)
               ((long)&(this->program_->modules_).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar2);
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_00138340;
    }
  }
  makeName(&local_60,this,name);
  pBVar4 = insert<flow::BinaryInstr<(flow::BinaryOperator)26,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                     (this,&lhs_local,&rhs_local,&local_60);
LAB_00138340:
  std::__cxx11::string::~string((string *)&local_60);
  return (Value *)pBVar4;
}

Assistant:

Value* IRBuilder::createSCmpLT(Value* lhs, Value* rhs,
                               const std::string& name) {
  assert(lhs->type() == rhs->type());
  assert(lhs->type() == LiteralType::String);

  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(a->get() < b->get());

  return insert<SCmpLTInstr>(lhs, rhs, makeName(name));
}